

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void process(int argc,char **argv)

{
  undefined1 *puVar1;
  uint *puVar2;
  int iVar3;
  long *plVar4;
  int *piVar5;
  long lVar6;
  size_t sVar7;
  ostream *poVar8;
  undefined8 uVar9;
  _func_int **pp_Var10;
  long *plVar11;
  size_type *psVar12;
  uint uVar13;
  ulong uVar14;
  char *pcVar15;
  double noise_level;
  Error EVar16;
  undefined1 local_cb0 [8];
  DataManager data;
  ofstream output;
  ios_base local_318 [264];
  undefined1 local_210 [8];
  ParameterSet param_denoiser;
  undefined1 local_e0 [16];
  string local_d0;
  undefined1 *local_b0;
  string model_name;
  size_type *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long local_58;
  long lStack_50;
  uint local_44;
  char **local_40;
  allocator local_31;
  
  local_40 = argv;
  std::__cxx11::string::string((string *)&local_b0,argv[2],(allocator *)local_cb0);
  std::__cxx11::string::substr((ulong)local_cb0,(ulong)&local_b0);
  std::__cxx11::string::operator=((string *)&local_b0,(string *)local_cb0);
  puVar1 = &data.original_mesh_.super_Mesh.
            super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
            .
            super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
            .field_0x8;
  if (local_cb0 != (undefined1  [8])puVar1) {
    operator_delete((void *)local_cb0);
  }
  psVar12 = &param_denoiser.name_._M_string_length;
  local_210 = (undefined1  [8])psVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,".out","");
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_210,0,(char *)0x0,(ulong)local_b0);
  pp_Var10 = (_func_int **)(plVar4 + 2);
  if ((_func_int **)*plVar4 == pp_Var10) {
    data.original_mesh_.super_Mesh.
    super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
    .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>._8_8_
         = *pp_Var10;
    data.original_mesh_.super_Mesh.
    super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
    .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
    _16_8_ = plVar4[3];
    local_cb0 = (undefined1  [8])puVar1;
  }
  else {
    data.original_mesh_.super_Mesh.
    super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
    .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>._8_8_
         = *pp_Var10;
    local_cb0 = (undefined1  [8])*plVar4;
  }
  data.original_mesh_.super_Mesh.
  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
  .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>._0_8_ =
       plVar4[1];
  *plVar4 = (long)pp_Var10;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::ofstream::ofstream
            (&data.mesh_.super_Mesh.
              super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
              .
              super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
              .refcount_fcolors_,(string *)local_cb0,_S_app);
  if (local_cb0 != (undefined1  [8])puVar1) {
    operator_delete((void *)local_cb0);
  }
  if (local_210 != (undefined1  [8])psVar12) {
    operator_delete((void *)local_210);
  }
  DataManager::DataManager((DataManager *)local_cb0);
  ParameterSet::ParameterSet((ParameterSet *)local_210);
  std::__cxx11::string::string
            ((string *)&param_denoiser.bool_dict._M_t._M_impl.super__Rb_tree_header._M_node_count,
             local_40[2],(allocator *)(__str.field_2._M_local_buf + 8));
  DataManager::ImportMeshFromFile
            ((DataManager *)local_cb0,
             (string *)&param_denoiser.bool_dict._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if ((undefined1 *)param_denoiser.bool_dict._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      local_e0) {
    operator_delete((void *)param_denoiser.bool_dict._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count);
  }
  local_44 = argc;
  std::__cxx11::string::string((string *)(__str.field_2._M_local_buf + 8),local_40[3],&local_31);
  uVar9 = __str.field_2._8_8_;
  piVar5 = __errno_location();
  iVar3 = *piVar5;
  *piVar5 = 0;
  noise_level = strtod((char *)uVar9,(char **)&local_88);
  if (local_88 == (size_type *)uVar9) {
    std::__throw_invalid_argument("stod");
LAB_00195680:
    std::__throw_invalid_argument("stoi");
LAB_0019568c:
    std::__throw_out_of_range("stoi");
  }
  else {
    if (*piVar5 == 0) {
LAB_0019525d:
      *piVar5 = iVar3;
    }
    else if (*piVar5 == 0x22) {
      noise_level = (double)std::__throw_out_of_range("stod");
      goto LAB_0019525d;
    }
    addNoise((DataManager *)local_cb0,noise_level);
    if ((long *)__str.field_2._8_8_ != &local_58) {
      operator_delete((void *)__str.field_2._8_8_);
    }
    local_88 = &__str._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,local_b0,model_name._M_dataplus._M_p + (long)local_b0);
    std::__cxx11::string::append((char *)&local_88);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_88);
    plVar11 = plVar4 + 2;
    if ((long *)*plVar4 == plVar11) {
      local_58 = *plVar11;
      lStack_50 = plVar4[3];
      __str.field_2._8_8_ = &local_58;
    }
    else {
      local_58 = *plVar11;
      __str.field_2._8_8_ = (long *)*plVar4;
    }
    *plVar4 = (long)plVar11;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
    psVar12 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_d0.field_2._M_allocated_capacity = *psVar12;
      local_d0.field_2._8_8_ = plVar4[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar12;
      local_d0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_d0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar12;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    DataManager::ExportMeshToFile((DataManager *)local_cb0,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    uVar13 = local_44;
    if ((long *)__str.field_2._8_8_ != &local_58) {
      operator_delete((void *)__str.field_2._8_8_);
    }
    if (local_88 != &__str._M_string_length) {
      operator_delete(local_88);
    }
    std::chrono::_V2::system_clock::now();
    denoise((DataManager *)local_cb0,uVar13,local_40);
    std::chrono::_V2::system_clock::now();
    EVar16 = estimateMSAE((DataManager *)local_cb0);
    model_name.field_2._8_8_ = EVar16.first;
    std::__cxx11::string::string((string *)(__str.field_2._M_local_buf + 8),local_40[1],&local_31);
    uVar9 = __str.field_2._8_8_;
    iVar3 = *piVar5;
    *piVar5 = 0;
    lVar6 = strtol((char *)__str.field_2._8_8_,(char **)&local_88,10);
    if (local_88 == (size_type *)uVar9) goto LAB_00195680;
    if (((int)lVar6 != lVar6) || (*piVar5 == 0x22)) goto LAB_0019568c;
    if (*piVar5 == 0) {
      *piVar5 = iVar3;
    }
    if ((long *)__str.field_2._8_8_ != &local_58) {
      operator_delete((void *)__str.field_2._8_8_);
    }
    if ((int)lVar6 == 1) {
      lVar6 = 0xb;
      pcVar15 = "Bilateral: ";
LAB_001954e0:
      uVar13 = local_44;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 &data.mesh_.super_Mesh.
                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                  .
                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                  .refcount_fcolors_,pcVar15,lVar6);
LAB_001954ec:
      if (3 < (int)uVar13) {
        uVar14 = 3;
        puVar2 = &data.mesh_.super_Mesh.
                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                  .
                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                  .refcount_fcolors_;
        do {
          pcVar15 = local_40[uVar14];
          if (pcVar15 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)
                                  (data.mesh_.super_Mesh.
                                   super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                   .
                                   super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                   ._544_8_ + -0x18) + (int)&stack0xfffffffffffffff8 + 0xfffffbf8);
          }
          else {
            sVar7 = strlen(pcVar15);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar2,pcVar15,sVar7);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar2," ",1);
          uVar14 = uVar14 + 1;
        } while (uVar13 != uVar14);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 &data.mesh_.super_Mesh.
                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                  .
                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                  .refcount_fcolors_,"noisy:",6);
      poVar8 = std::ostream::_M_insert<double>((double)model_name.field_2._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," denoised:",10);
      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      std::ofstream::close();
      ParameterSet::~ParameterSet((ParameterSet *)local_210);
      OpenMesh::PolyConnectivity::~PolyConnectivity
                ((PolyConnectivity *)
                 &data.denoised_mesh_.super_Mesh.
                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                  .
                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                  .refcount_fcolors_);
      OpenMesh::PolyConnectivity::~PolyConnectivity
                ((PolyConnectivity *)
                 &data.noisy_mesh_.super_Mesh.
                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                  .
                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                  .refcount_fcolors_);
      OpenMesh::PolyConnectivity::~PolyConnectivity
                ((PolyConnectivity *)
                 &data.original_mesh_.super_Mesh.
                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                  .
                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                  .refcount_fcolors_);
      OpenMesh::PolyConnectivity::~PolyConnectivity((PolyConnectivity *)local_cb0);
      data.mesh_.super_Mesh.
      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
      .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
      refcount_fcolors_ = _VTT;
      data.mesh_.super_Mesh.
      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
      .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
      refcount_ftextureIndex_ = std::ofstream::VTT_4;
      *(undefined8 *)
       ((long)&data.mesh_.super_Mesh.
               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
               .
               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
               .refcount_fcolors_ + *(long *)(_VTT + -0x18)) = _sqrt;
      std::filebuf::~filebuf((filebuf *)&output);
      std::ios_base::~ios_base(local_318);
      if ((size_type *)local_b0 != &model_name._M_string_length) {
        operator_delete(local_b0);
      }
      return;
    }
    std::__cxx11::string::string((string *)(__str.field_2._M_local_buf + 8),local_40[1],&local_31);
    uVar9 = __str.field_2._8_8_;
    iVar3 = *piVar5;
    *piVar5 = 0;
    lVar6 = strtol((char *)__str.field_2._8_8_,(char **)&local_88,10);
    if (local_88 != (size_type *)uVar9) {
      if ((lVar6 - 0x80000000U < 0xffffffff00000000) || (*piVar5 == 0x22)) goto LAB_001956a4;
      if (*piVar5 == 0) {
        *piVar5 = iVar3;
      }
      if ((long *)__str.field_2._8_8_ != &local_58) {
        operator_delete((void *)__str.field_2._8_8_);
      }
      uVar13 = local_44;
      if ((int)lVar6 != 2) goto LAB_001954ec;
      lVar6 = 0x11;
      pcVar15 = " Fast&Effective: ";
      goto LAB_001954e0;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_001956a4:
  uVar9 = std::__throw_out_of_range("stoi");
  ParameterSet::~ParameterSet((ParameterSet *)local_210);
  DataManager::~DataManager((DataManager *)local_cb0);
  std::ofstream::~ofstream
            (&data.mesh_.super_Mesh.
              super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
              .
              super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
              .refcount_fcolors_);
  if ((size_type *)local_b0 != &model_name._M_string_length) {
    operator_delete(local_b0);
  }
  _Unwind_Resume(uVar9);
}

Assistant:

void process(int argc, char *argv[])
{
    auto model_name = string(argv[2]);
    model_name = model_name.substr(0, model_name.length() - 4);
    std::ofstream output(model_name + string(".out"), std::ios::app);
    DataManager data;
    ParameterSet param_denoiser;
    // Add noise to model and export it
    data.ImportMeshFromFile(argv[2]);
    addNoise(&data, std::stod(argv[3]));
    data.ExportMeshToFile(model_name + "(noisy " + argv[3]  + ").obj");
    // Denoise the model then measure the error and the duration
    auto beg = std::chrono::high_resolution_clock::now();
    denoise(&data, argc, argv);
    auto end = std::chrono::high_resolution_clock::now();

    auto duration = std::chrono::duration_cast<std::chrono::milliseconds>(end - beg).count();
    auto er = estimateMSAE(data);
    // export the denoised model.
    if(std::stoi(argv[1]) == 1)
        output << "Bilateral: ";
    else if(std::stoi(argv[1]) == 2)
        output << " Fast&Effective: ";

    for(int i = 3; i < argc; ++i)
        output << argv[i] << " ";
    output << "noisy:" << er.first << " denoised:" << std::endl;
    output.close();
}